

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int WriteOptionPick(TidyOptionImpl *option,uint ival,StreamOut *out)

{
  PickListItems *paPVar1;
  ctmbstr sval;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  paPVar1 = option->pickList;
  iVar3 = -1;
  if (paPVar1 != (PickListItems *)0x0) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (ival <= uVar4) break;
      uVar2 = uVar4 + 1;
    } while ((*paPVar1)[uVar4].label != (ctmbstr)0x0);
    iVar3 = -1;
    if ((ival + 1 == uVar4 + 1) && (sval = (*paPVar1)[uVar4].label, sval != (ctmbstr)0x0)) {
      WriteOptionString(option,sval,out);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int  WriteOptionPick( const TidyOptionImpl* option, uint ival, StreamOut* out )
{
    uint ix = 0;
    const PickListItem *item = NULL;
    
    if ( option-> pickList )
    {
        while ( (item = &(*option->pickList)[ ix ]) && item->label && ix<ival )
        {
            ++ix;
        }
        if ( ix==ival && item->label )
            return WriteOptionString( option, item->label, out );
    }
    
    return -1;
}